

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O1

void __thiscall ZmqContextManager::~ZmqContextManager(ZmqContextManager *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (((this->leakOnDelete)._M_base._M_i & 1U) != 0) {
    (this->zcontext)._M_t.
    super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
    super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
    super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl = (context_t *)0x0;
  }
  std::unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_>::~unique_ptr
            (&this->zcontext);
  pcVar1 = (this->name)._M_dataplus._M_p;
  paVar2 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ZmqContextManager::~ZmqContextManager()
{
    // std::cout << "destroying context in " << std::this_thread::get_id() << std::endl;

    if (leakOnDelete) {
        // yes I am purposefully leaking this( PHILIP TOP)
        // do the vagaries of library closeout this may end up being destroyed too soon and can
        // cause some extraneous errors to show up when closing programs, so this just lets the OS
        // process cleanup since the only issues occur on program termination, in other situations
        // closing does present an issue and since this particular object is mostly only closed on
        // termination this is the default.
        auto* val = zcontext.release();
        (void)(val);
    }
}